

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O1

PhysicalDeviceDetails * add_basic_physical_device(VulkanMock *mock)

{
  long lVar1;
  VkExtensionProperties ext_props;
  VkExtensionProperties local_e68;
  undefined4 local_d60 [74];
  undefined1 local_c38 [528];
  undefined1 local_a28 [224];
  undefined1 local_948 [260];
  undefined1 local_844 [260];
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_740;
  pointer pVStack_728;
  iterator local_720;
  VkQueueFamilyProperties *pVStack_718;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_710;
  pointer ppVStack_6f8;
  pointer local_6f0;
  pointer ppVStack_6e8;
  vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  local_6e0;
  PhysicalDeviceDetails local_6c8;
  
  memset(local_d60,0,0x124);
  memset(local_c38,0,0x20c);
  memset(local_a28,0,0xdc);
  memset(local_948,0,0x104);
  memset(local_844,0,0x104);
  local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (VkExtensionProperties *)0x0;
  local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (VkExtensionProperties *)0x0;
  pVStack_728 = (pointer)0x0;
  local_720._M_current = (VkQueueFamilyProperties *)0x0;
  pVStack_718 = (VkQueueFamilyProperties *)0x0;
  local_710.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_710.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_710.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVStack_6f8 = (pointer)0x0;
  local_6f0 = (pointer)0x0;
  ppVStack_6e8 = (pointer)0x0;
  local_6e0.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e0.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(local_e68.extensionName + 0x11,0,0xf3);
  builtin_strncpy(local_e68.extensionName,"VK_KHR_swapchain",0x10);
  local_e68.extensionName._16_8_ = local_e68.extensionName._16_8_ & 0xffffffffffffff00;
  if (local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
    _M_realloc_insert<VkExtensionProperties>
              (&local_740,
               (iterator)
               local_740.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_e68);
  }
  else {
    memcpy(local_740.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish,&local_e68,0x104);
    local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_d60[0] = 0x400000;
  local_e68.extensionName[0] = '\a';
  local_e68.extensionName[1] = '\0';
  local_e68.extensionName[2] = '\0';
  local_e68.extensionName[3] = '\0';
  local_e68.extensionName[4] = '\x01';
  local_e68.extensionName[5] = '\0';
  local_e68.extensionName[6] = '\0';
  local_e68.extensionName[7] = '\0';
  local_e68.extensionName[8] = '\0';
  local_e68.extensionName[9] = '\0';
  local_e68.extensionName[10] = '\0';
  local_e68.extensionName[0xb] = '\0';
  local_e68.extensionName[0xc] = '\x01';
  local_e68.extensionName[0xd] = '\0';
  local_e68.extensionName[0xe] = '\0';
  local_e68.extensionName[0xf] = '\0';
  local_e68.extensionName[0x10] = '\x01';
  local_e68.extensionName[0x11] = '\0';
  local_e68.extensionName[0x12] = '\0';
  local_e68.extensionName[0x13] = '\0';
  local_e68.extensionName[0x14] = '\x01';
  local_e68.extensionName[0x15] = '\0';
  local_e68.extensionName[0x16] = '\0';
  local_e68.extensionName[0x17] = '\0';
  if (local_720._M_current == pVStack_718) {
    std::vector<VkQueueFamilyProperties,std::allocator<VkQueueFamilyProperties>>::
    _M_realloc_insert<VkQueueFamilyProperties_const&>
              ((vector<VkQueueFamilyProperties,std::allocator<VkQueueFamilyProperties>> *)
               &pVStack_728,local_720,(VkQueueFamilyProperties *)&local_e68);
  }
  else {
    ((local_720._M_current)->minImageTransferGranularity).height = 1;
    ((local_720._M_current)->minImageTransferGranularity).depth = 1;
    (local_720._M_current)->queueFlags = 7;
    (local_720._M_current)->queueCount = 1;
    (local_720._M_current)->timestampValidBits = 0;
    ((local_720._M_current)->minImageTransferGranularity).width = 1;
    local_720._M_current = local_720._M_current + 1;
  }
  memcpy(&local_6c8,local_d60,0x620);
  local_6c8.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_6c8.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_6c8.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c8.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = pVStack_728;
  local_6c8.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = local_720._M_current;
  local_6c8.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pVStack_718;
  pVStack_718 = (VkQueueFamilyProperties *)0x0;
  pVStack_728 = (pointer)0x0;
  local_720._M_current = (VkQueueFamilyProperties *)0x0;
  local_6c8.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_710.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_6c8.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_710.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_6c8.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_710.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_710.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_710.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_710.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppVStack_6f8;
  local_6c8.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_6f0;
  local_6c8.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppVStack_6e8;
  ppVStack_6e8 = (pointer)0x0;
  ppVStack_6f8 = (pointer)0x0;
  local_6f0 = (pointer)0x0;
  local_6c8.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6e0.
       super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_6c8.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6e0.
       super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_6c8.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6e0.
       super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6e0.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e0.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e0.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  VulkanMock::add_physical_device(mock,&local_6c8);
  std::vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>::
  ~vector(&local_6c8.created_device_details);
  if (local_6c8.created_device_handles.
      super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6c8.created_device_handles.
                    super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6c8.created_device_handles.
                          super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6c8.created_device_handles.
                          super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_6c8.features_pNextChain);
  if (local_6c8.queue_family_properties.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6c8.queue_family_properties.
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6c8.queue_family_properties.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6c8.queue_family_properties.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6c8.extensions.
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6c8.extensions.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6c8.extensions.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6c8.extensions.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar1 = *(long *)&mock->field_0xb8;
  std::vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>::
  ~vector(&local_6e0);
  if (ppVStack_6f8 != (pointer)0x0) {
    operator_delete(ppVStack_6f8,(long)ppVStack_6e8 - (long)ppVStack_6f8);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_710);
  if (pVStack_728 != (pointer)0x0) {
    operator_delete(pVStack_728,(long)pVStack_718 - (long)pVStack_728);
  }
  if (local_740.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_740.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_740.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_740.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (PhysicalDeviceDetails *)(lVar1 + -0x698);
}

Assistant:

VulkanMock::PhysicalDeviceDetails& add_basic_physical_device(VulkanMock& mock) {
    VulkanMock::PhysicalDeviceDetails physical_device_details{};
    physical_device_details.extensions.push_back(get_extension_properties(VK_KHR_SWAPCHAIN_EXTENSION_NAME));
    physical_device_details.properties.apiVersion = VK_API_VERSION_1_0;
    VkQueueFamilyProperties queue_family_properties{};
    queue_family_properties.queueCount = 1;
    queue_family_properties.queueFlags = VK_QUEUE_GRAPHICS_BIT | VK_QUEUE_COMPUTE_BIT | VK_QUEUE_TRANSFER_BIT;
    queue_family_properties.minImageTransferGranularity = { 1, 1, 1 };
    physical_device_details.queue_family_properties.push_back(queue_family_properties);
    mock.add_physical_device(std::move(physical_device_details));
    return mock.physical_devices_details.back();
}